

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_readwrite.c
# Opt level: O2

int canvas_scanbinbuf(int natoms,t_atom *vec,int *p_indexout,int *p_next)

{
  int iVar1;
  long lVar2;
  t_atom *ptVar3;
  int iVar4;
  long lVar5;
  
  iVar1 = *p_next;
  lVar5 = (long)iVar1;
  *p_indexout = iVar1;
  iVar4 = 0;
  if (iVar1 < natoms) {
    lVar2 = (long)natoms;
    ptVar3 = vec + lVar5;
    for (; lVar5 < lVar2; lVar5 = lVar5 + 1) {
      if (ptVar3->a_type == A_SEMI) {
        natoms = (int)lVar5;
        break;
      }
      ptVar3 = ptVar3 + 1;
    }
    *p_next = (uint)(lVar5 < lVar2) + natoms;
    iVar4 = natoms - iVar1;
  }
  return iVar4;
}

Assistant:

static int canvas_scanbinbuf(int natoms, t_atom *vec, int *p_indexout,
    int *p_next)
{
    int i;
    int indexwas = *p_next;
    *p_indexout = indexwas;
    if (indexwas >= natoms)
        return (0);
    for (i = indexwas; i < natoms && vec[i].a_type != A_SEMI; i++)
        ;
    if (i >= natoms)
        *p_next = i;
    else *p_next = i + 1;
    return (i - indexwas);
}